

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Client.cpp
# Opt level: O2

shared_ptr<Jupiter::IRC::Client::User> __thiscall
Jupiter::IRC::Client::getUser(Client *this,string_view in_nickname)

{
  const_iterator cVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  shared_ptr<Jupiter::IRC::Client::User> sVar3;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  local_18._M_len = (size_t)in_nickname._M_str;
  cVar1 = std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<Jupiter::IRC::Client::User>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<Jupiter::IRC::Client::User>>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_find_tr<std::basic_string_view<char,std::char_traits<char>>,void,void>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<Jupiter::IRC::Client::User>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<Jupiter::IRC::Client::User>>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)(in_nickname._M_len + 0x278),&local_18);
  if (cVar1.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Jupiter::IRC::Client::User>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    (this->super_Thinker)._vptr_Thinker = (_func_int **)0x0;
    (this->m_socket)._M_t.
    super___uniq_ptr_impl<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_>._M_t.
    super__Tuple_impl<0UL,_Jupiter::Socket_*,_std::default_delete<Jupiter::Socket>_>.
    super__Head_base<0UL,_Jupiter::Socket_*,_false>._M_head_impl = (Socket *)0x0;
    _Var2._M_pi = extraout_RDX;
  }
  else {
    std::__shared_ptr<Jupiter::IRC::Client::User,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<Jupiter::IRC::Client::User,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<Jupiter::IRC::Client::User,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)cVar1.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Jupiter::IRC::Client::User>_>,_false>
                      ._M_cur + 0x28));
    _Var2._M_pi = extraout_RDX_00;
  }
  sVar3.super___shared_ptr<Jupiter::IRC::Client::User,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var2._M_pi;
  sVar3.super___shared_ptr<Jupiter::IRC::Client::User,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<Jupiter::IRC::Client::User>)
         sVar3.super___shared_ptr<Jupiter::IRC::Client::User,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Jupiter::IRC::Client::User> Jupiter::IRC::Client::getUser(std::string_view in_nickname) const {
	auto user = m_users.find(JUPITER_WRAP_MAP_KEY(in_nickname));
	if (user != m_users.end()) {
		return user->second;
	}

	return nullptr;
}